

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>
          (basic_appender<char> out,unsigned_long value,uint prefix,format_specs *specs,
          digit_grouping<char> *grouping)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  byte *pbVar7;
  basic_appender<char> bVar8;
  unsigned_long uVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  char cVar13;
  uint uVar14;
  size_t sVar15;
  size_t size;
  bool bVar16;
  memory_buffer buffer;
  uint local_294;
  basic_appender<char> local_290;
  anon_class_24_3_e2c60416 local_288 [2];
  memory_buffer local_248;
  
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar14 = (specs->super_basic_specs).data_;
  local_294 = prefix;
  switch(uVar14 & 7) {
  case 4:
    if ((uVar14 >> 0xd & 1) != 0) {
      uVar3 = (uint)((uVar14 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar4 = uVar3 << 8;
      if (prefix == 0) {
        uVar4 = uVar3;
      }
      local_294 = (uVar4 | prefix) + 0x2000000;
    }
    prefix = local_294;
    uVar9 = value;
    size = 0;
    do {
      sVar15 = size;
      size = sVar15 + 1;
      bVar16 = 0xf < uVar9;
      uVar9 = uVar9 >> 4;
    } while (bVar16);
    uVar10 = size;
    local_290.container = out.container;
    if (499 < (uint)sVar15) {
      basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
      uVar10 = local_248.super_buffer<char>.size_ + size;
    }
    sVar2 = local_248.super_buffer<char>.size_;
    if ((local_248.super_buffer<char>.capacity_ < uVar10) ||
       (sVar2 = uVar10, local_248.super_buffer<char>.ptr_ == (char *)0x0)) {
      local_248.super_buffer<char>.size_ = sVar2;
      pcVar6 = (char *)((long)&local_288[0].prefix + sVar15);
      pcVar11 = "0123456789ABCDEF";
      if ((uVar14 >> 0xc & 1) == 0) {
        pcVar11 = "0123456789abcdef";
      }
      do {
        *pcVar6 = pcVar11[(uint)value & 0xf];
        pcVar6 = pcVar6 + -1;
        bVar16 = 0xf < value;
        value = value >> 4;
      } while (bVar16);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_288,(char *)((long)&local_288[0].prefix + sVar15 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar6 = "0123456789ABCDEF";
      if ((uVar14 >> 0xc & 1) == 0) {
        pcVar6 = "0123456789abcdef";
      }
      pcVar11 = local_248.super_buffer<char>.ptr_ + size + local_248.super_buffer<char>.size_;
      do {
        pcVar11 = pcVar11 + -1;
        *pcVar11 = pcVar6[(uint)value & 0xf];
        bVar16 = 0xf < value;
        value = value >> 4;
        local_248.super_buffer<char>.size_ = uVar10;
      } while (bVar16);
    }
    break;
  case 5:
    uVar9 = value;
    size = 0;
    do {
      sVar15 = size;
      size = sVar15 + 1;
      bVar16 = 7 < uVar9;
      uVar9 = uVar9 >> 3;
    } while (bVar16);
    if ((((uVar14 >> 0xd & 1) != 0) && (value != 0)) && (specs->precision <= (int)size)) {
      uVar14 = 0x3000;
      if (prefix == 0) {
        uVar14 = 0x30;
      }
      local_294 = (uVar14 | prefix) + 0x1000000;
    }
    prefix = local_294;
    uVar10 = size;
    local_290.container = out.container;
    if (499 < (uint)sVar15) {
      basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
      uVar10 = local_248.super_buffer<char>.size_ + size;
    }
    sVar2 = local_248.super_buffer<char>.size_;
    if ((local_248.super_buffer<char>.capacity_ < uVar10) ||
       (sVar2 = uVar10, local_248.super_buffer<char>.ptr_ == (char *)0x0)) {
      local_248.super_buffer<char>.size_ = sVar2;
      pbVar7 = (byte *)((long)&local_288[0].prefix + sVar15);
      do {
        *pbVar7 = (byte)value & 7 | 0x30;
        pbVar7 = pbVar7 + -1;
        bVar16 = 7 < value;
        value = value >> 3;
      } while (bVar16);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_288,(char *)((long)&local_288[0].prefix + sVar15 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar6 = local_248.super_buffer<char>.ptr_ + size + local_248.super_buffer<char>.size_;
      do {
        pcVar6 = pcVar6 + -1;
        *pcVar6 = (byte)value & 7 | 0x30;
        bVar16 = 7 < value;
        value = value >> 3;
        local_248.super_buffer<char>.size_ = uVar10;
      } while (bVar16);
    }
    break;
  case 6:
    if ((uVar14 >> 0xd & 1) != 0) {
      uVar4 = (uint)((uVar14 >> 0xc & 1) == 0) << 0xd | 0x4230;
      uVar14 = uVar4 << 8;
      if (prefix == 0) {
        uVar14 = uVar4;
      }
      local_294 = (uVar14 | prefix) + 0x2000000;
    }
    prefix = local_294;
    uVar9 = value;
    size = 0;
    do {
      sVar15 = size;
      size = sVar15 + 1;
      bVar16 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar16);
    uVar10 = size;
    local_290.container = out.container;
    if (499 < (uint)sVar15) {
      basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
      uVar10 = local_248.super_buffer<char>.size_ + size;
    }
    sVar2 = local_248.super_buffer<char>.size_;
    if ((local_248.super_buffer<char>.capacity_ < uVar10) ||
       (sVar2 = uVar10, local_248.super_buffer<char>.ptr_ == (char *)0x0)) {
      local_248.super_buffer<char>.size_ = sVar2;
      pbVar7 = (byte *)((long)&local_288[0].prefix + sVar15);
      do {
        *pbVar7 = (byte)value & 1 | 0x30;
        pbVar7 = pbVar7 + -1;
        bVar16 = 1 < value;
        value = value >> 1;
      } while (bVar16);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_288,(char *)((long)&local_288[0].prefix + sVar15 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar6 = local_248.super_buffer<char>.ptr_ + size + local_248.super_buffer<char>.size_;
      do {
        pcVar6 = pcVar6 + -1;
        *pcVar6 = (byte)value & 1 | 0x30;
        bVar16 = 1 < value;
        value = value >> 1;
        local_248.super_buffer<char>.size_ = uVar10;
      } while (bVar16);
    }
    break;
  case 7:
    local_288[0].prefix._0_2_ = CONCAT11((char)value,(uVar14 & 7) == 1);
    bVar8 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_288);
    goto LAB_002062c8;
  default:
    lVar1 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar14 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar1] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar1]
                                      * 8));
    size = (size_t)uVar14;
    local_290.container = out.container;
    format_decimal<char,_unsigned_long,_fmt::v11::basic_appender<char>,_0>
              (&local_248.super_buffer<char>,value,uVar14);
  }
  if ((grouping->thousands_sep_)._M_string_length != 0) {
    pcVar6 = (grouping->grouping_)._M_dataplus._M_p;
    pcVar11 = pcVar6 + (grouping->grouping_)._M_string_length;
    iVar5 = 0;
    iVar12 = 0;
    do {
      if (pcVar6 == pcVar11) {
        cVar13 = pcVar11[-1];
        pcVar6 = pcVar11;
      }
      else {
        cVar13 = *pcVar6;
        if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_00206298;
        pcVar6 = pcVar6 + 1;
      }
      iVar12 = iVar12 + cVar13;
      if ((int)size <= iVar12) goto LAB_00206298;
      iVar5 = iVar5 + 1;
    } while( true );
  }
  iVar5 = 0;
LAB_00206298:
  uVar10 = (ulong)((prefix >> 0x18) + (int)size + iVar5);
  local_288[0].prefix = &local_294;
  local_288[0].buffer = &local_248;
  local_288[0].grouping = grouping;
  bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>(fmt::v11::basic_appender<char>,unsigned_long,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (local_290,specs,uVar10,uVar10,local_288);
LAB_002062c8:
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    free(local_248.super_buffer<char>.ptr_);
  }
  return (basic_appender<char>)bVar8.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}